

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O0

bool __thiscall triangle::contains(triangle *this,vec2 *p,float r)

{
  int a_00;
  vec2 *a_01;
  double dVar1;
  bool local_5a;
  byte local_59;
  vec2 local_50;
  vec2 local_48;
  vec2 local_40;
  float_t local_38;
  float_t local_34;
  float y;
  float x;
  float a;
  float u;
  int i;
  int cnt;
  bool res;
  vec2 *pvStack_18;
  float r_local;
  vec2 *p_local;
  triangle *this_local;
  
  cnt = (int)r;
  pvStack_18 = p;
  p_local = this->v;
  i._3_1_ = contains(this,p);
  u = 3.58732e-43;
  a = 0.0;
  while( true ) {
    local_59 = 0;
    if ((int)a < (int)u) {
      local_59 = i._3_1_ ^ 0xff;
    }
    if ((local_59 & 1) == 0) break;
    x = (float)(int)a / (float)(int)u;
    y = x * 2.0 * 3.1415927;
    dVar1 = std::cos((double)(ulong)(uint)y);
    local_34 = SUB84(dVar1,0);
    dVar1 = std::sin((double)(ulong)(uint)y);
    a_01 = pvStack_18;
    a_00 = cnt;
    local_38 = SUB84(dVar1,0);
    local_5a = true;
    if ((i._3_1_ & 1) == 0) {
      dja::vec2::vec2(&local_50,local_34,local_38);
      local_48 = dja::operator*((float_t)a_00,&local_50);
      local_40 = dja::operator+(a_01,&local_48);
      local_5a = contains(this,&local_40);
    }
    i._3_1_ = local_5a;
    a = (float)((int)a + 1);
  }
  return (bool)i._3_1_;
}

Assistant:

bool contains(const dja::vec2 &p, float r) const {
        bool res = contains(p);
        int cnt = 256;

        for (int i = 0; i < cnt && !res; ++i) {
            float u = i / float(cnt);
            float a = u * 2 * M_PI;
            float x = cos(a), y = sin(a);

            res = res || contains(p + r * dja::vec2(x, y));
        }

        return res;
    }